

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_find.c
# Opt level: O0

mpt_node * mpt_node_find(mpt_node *parent,char *name,int pos)

{
  int *piVar1;
  size_t sVar2;
  mpt_node *pmVar3;
  int local_40;
  int idlen;
  mpt_node *tmp;
  int pos_local;
  char *name_local;
  mpt_node *parent_local;
  
  if ((parent == (mpt_node *)0x0) || (pmVar3 = parent->children, pmVar3 == (mpt_node *)0x0)) {
    piVar1 = __errno_location();
    *piVar1 = 0x16;
    parent_local = (mpt_node *)0x0;
  }
  else {
    if (name == (char *)0x0) {
      local_40 = 0;
    }
    else {
      sVar2 = strlen(name);
      local_40 = (int)sVar2;
    }
    if (pos < 0) {
      pmVar3 = mpt_node_locate(pmVar3,0,name,(long)local_40,-1);
      if (pmVar3 == (mpt_node *)0x0) {
        parent_local = (mpt_node *)0x0;
      }
      else {
        parent_local = mpt_node_locate(pmVar3,pos,name,(long)local_40,-1);
      }
    }
    else {
      parent_local = mpt_node_locate(pmVar3,pos,name,(long)local_40,-1);
    }
  }
  return parent_local;
}

Assistant:

extern MPT_STRUCT(node) *mpt_node_find(const MPT_STRUCT(node) *parent, const char *name, int pos)
{
	MPT_STRUCT(node) *tmp;
	int idlen;
	
	if (!parent || !(tmp = parent->children)) {
		errno = EINVAL;
		return NULL;
	}
	idlen = name ? strlen(name) : 0;
	
	if (pos >= 0) {
		return mpt_node_locate(tmp, pos, name, idlen, -1);
	}
	if (!(tmp = mpt_node_locate(tmp, 0, name, idlen, -1))) {
		return 0;
	}
	return mpt_node_locate(tmp, pos, name, idlen, -1);
}